

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O3

int __thiscall BamTools::MergeTool::Run(MergeTool *this,int argc,char **argv)

{
  bool bVar1;
  MergeToolPrivate *this_00;
  
  Options::Parse(argc,argv,1);
  this_00 = (MergeToolPrivate *)operator_new(8);
  this_00->m_settings = this->m_settings;
  this->m_impl = this_00;
  bVar1 = MergeToolPrivate::Run(this_00);
  return (int)!bVar1;
}

Assistant:

int MergeTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize MergeTool with settings
    m_impl = new MergeToolPrivate(m_settings);

    // run MergeTool, return success/fail
    if (m_impl->Run())
        return 0;
    else
        return 1;
}